

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur,xmlNsPtr ns,xmlC14NCtxPtr ctx)

{
  xmlNodePtr pxVar1;
  int iVar2;
  uint local_8c;
  xmlChar *local_88;
  _xmlNode *local_78;
  bool local_61;
  xmlChar *local_60;
  xmlChar *local_58;
  xmlNsPtr ns1;
  int start;
  int has_empty_ns;
  xmlChar *href;
  xmlChar *prefix;
  int i;
  xmlC14NCtxPtr ctx_local;
  xmlNsPtr ns_local;
  xmlC14NVisibleNsStackPtr cur_local;
  
  if (cur == (xmlC14NVisibleNsStackPtr)0x0) {
    xmlC14NErrParam(ctx);
    cur_local._4_4_ = 0;
  }
  else {
    if ((ns == (xmlNsPtr)0x0) || (ns->prefix == (xmlChar *)0x0)) {
      local_58 = "";
    }
    else {
      local_58 = ns->prefix;
    }
    if ((ns == (xmlNsPtr)0x0) || (ns->href == (xmlChar *)0x0)) {
      local_60 = "";
    }
    else {
      local_60 = ns->href;
    }
    iVar2 = xmlC14NStrEqual(local_58,(xmlChar *)0x0);
    local_61 = false;
    if (iVar2 != 0) {
      iVar2 = xmlC14NStrEqual(local_60,(xmlChar *)0x0);
      local_61 = iVar2 != 0;
    }
    cur_local._4_4_ = (uint)local_61;
    if (cur->nsTab != (xmlNsPtr *)0x0) {
      prefix._4_4_ = cur->nsCurEnd;
      do {
        prefix._4_4_ = prefix._4_4_ + -1;
        if (prefix._4_4_ < 0) {
          return cur_local._4_4_;
        }
        pxVar1 = (xmlNodePtr)cur->nsTab[prefix._4_4_];
        if (pxVar1 == (xmlNodePtr)0x0) {
          local_78 = (_xmlNode *)0x0;
        }
        else {
          local_78 = pxVar1->children;
        }
        iVar2 = xmlC14NStrEqual(local_58,(xmlChar *)local_78);
      } while (iVar2 == 0);
      if (pxVar1 == (xmlNodePtr)0x0) {
        local_88 = (xmlChar *)0x0;
      }
      else {
        local_88 = pxVar1->name;
      }
      iVar2 = xmlC14NStrEqual(local_60,local_88);
      if (iVar2 == 0) {
        cur_local._4_4_ = 0;
      }
      else {
        if (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) {
          local_8c = 1;
        }
        else {
          local_8c = (*ctx->is_visible_callback)(ctx->user_data,pxVar1,cur->nodeTab[prefix._4_4_]);
        }
        cur_local._4_4_ = local_8c;
      }
    }
  }
  return cur_local._4_4_;
}

Assistant:

static int
xmlExcC14NVisibleNsStackFind(xmlC14NVisibleNsStackPtr cur, xmlNsPtr ns, xmlC14NCtxPtr ctx) {
    int i;
    const xmlChar *prefix;
    const xmlChar *href;
    int has_empty_ns;

    if(cur == NULL) {
        xmlC14NErrParam(ctx);
        return (0);
    }

    /*
     * if the default namespace xmlns="" is not defined yet then
     * we do not want to print it out
     */
    prefix = ((ns == NULL) || (ns->prefix == NULL)) ? BAD_CAST "" : ns->prefix;
    href = ((ns == NULL) || (ns->href == NULL)) ? BAD_CAST "" : ns->href;
    has_empty_ns = (xmlC14NStrEqual(prefix, NULL) && xmlC14NStrEqual(href, NULL));

    if (cur->nsTab != NULL) {
	int start = 0;
        for (i = cur->nsCurEnd - 1; i >= start; --i) {
            xmlNsPtr ns1 = cur->nsTab[i];

	    if(xmlC14NStrEqual(prefix, (ns1 != NULL) ? ns1->prefix : NULL)) {
		if(xmlC14NStrEqual(href, (ns1 != NULL) ? ns1->href : NULL)) {
		    return(xmlC14NIsVisible(ctx, ns1, cur->nodeTab[i]));
		} else {
		    return(0);
		}
	    }
        }
    }
    return(has_empty_ns);
}